

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int biseqcaselessblk(const_bstring b,void *blk,int len)

{
  uint uVar1;
  uint uVar2;
  uchar *local_38;
  int local_28;
  uchar c;
  int i;
  int len_local;
  void *blk_local;
  const_bstring b_local;
  
  if ((b == (const_bstring)0x0) || (b->data == (uchar *)0x0)) {
    local_38 = (uchar *)0x0;
  }
  else {
    local_38 = b->data;
  }
  if ((((local_38 == (uchar *)0x0) || (b->slen < 0)) || (blk == (void *)0x0)) || (len < 0)) {
    b_local._4_4_ = -1;
  }
  else if (b->slen == len) {
    if ((len == 0) || (b->data == (uchar *)blk)) {
      b_local._4_4_ = 1;
    }
    else {
      for (local_28 = 0; local_28 < len; local_28 = local_28 + 1) {
        if (b->data[local_28] != *(uchar *)((long)blk + (long)local_28)) {
          uVar1 = tolower((uint)b->data[local_28]);
          uVar2 = tolower((uint)*(byte *)((long)blk + (long)local_28));
          if ((uVar1 & 0xff) != (uVar2 & 0xff)) {
            return 0;
          }
        }
      }
      b_local._4_4_ = 1;
    }
  }
  else {
    b_local._4_4_ = 0;
  }
  return b_local._4_4_;
}

Assistant:

int biseqcaselessblk (const_bstring b, const void * blk, int len) {
int i;

	if (bdata (b) == NULL || b->slen < 0 ||
	    blk == NULL || len < 0) return BSTR_ERR;
	if (b->slen != len) return 0;
	if (len == 0 || b->data == blk) return 1;
	for (i=0; i < len; i++) {
		if (b->data[i] != ((unsigned char*)blk)[i]) {
			unsigned char c = (unsigned char) downcase (b->data[i]);
			if (c != (unsigned char) downcase (((unsigned char*)blk)[i]))
				return 0;
		}
	}
	return 1;
}